

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_pkt_generator.c
# Opt level: O0

void rfc5444_writer_set_pkt_header
               (rfc5444_writer *writer,rfc5444_writer_target *target,_Bool has_seqno)

{
  _Bool has_seqno_local;
  rfc5444_writer_target *target_local;
  rfc5444_writer *writer_local;
  
  if (writer->_state == RFC5444_WRITER_ADD_PKTHEADER) {
    (target->_pkt).header = 3;
    target->_has_seqno = has_seqno;
    if (has_seqno) {
      (target->_pkt).header = (target->_pkt).header + 2;
    }
    return;
  }
  __assert_fail("writer->_state == RFC5444_WRITER_ADD_PKTHEADER",
                "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_pkt_generator.c"
                ,0x118,
                "void rfc5444_writer_set_pkt_header(struct rfc5444_writer *, struct rfc5444_writer_target *, _Bool)"
               );
}

Assistant:

void
rfc5444_writer_set_pkt_header(
  struct rfc5444_writer *writer __attribute__((unused)), struct rfc5444_writer_target *target, bool has_seqno) {
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_ADD_PKTHEADER);
#endif

  /* we assume that we have always an TLV block and subtract the 2 bytes later */
  target->_pkt.header = 1 + 2;

  /* handle sequence number */
  target->_has_seqno = has_seqno;
  if (has_seqno) {
    target->_pkt.header += 2;
  }
}